

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mct.c
# Opt level: O0

void jpc_iict(jas_matrix_t *c0,jas_matrix_t *c1,jas_matrix_t *c2)

{
  jpc_fix_big_t y_00;
  jpc_fix_big_t y_01;
  int iVar1;
  int iVar2;
  jas_matind_t jVar3;
  jpc_fix_t jVar4;
  jpc_fix_t jVar5;
  jpc_fix_t jVar6;
  jpc_fix_t jVar7;
  jpc_fix_big_t *local_78;
  jpc_fix_t *c2p;
  jpc_fix_t *c1p;
  jpc_fix_t *c0p;
  jpc_fix_t v;
  jpc_fix_t u;
  jpc_fix_t y;
  jpc_fix_t b;
  jpc_fix_t g;
  jpc_fix_t r;
  int j;
  int i;
  int numcols;
  int numrows;
  jas_matrix_t *c2_local;
  jas_matrix_t *c1_local;
  jas_matrix_t *c0_local;
  
  jVar3 = jas_matrix_numrows(c0);
  iVar1 = (int)jVar3;
  jVar3 = jas_matrix_numrows(c1);
  if (jVar3 == iVar1) {
    jVar3 = jas_matrix_numrows(c2);
    if (jVar3 == iVar1) {
      jVar3 = jas_matrix_numcols(c0);
      iVar2 = (int)jVar3;
      jVar3 = jas_matrix_numcols(c1);
      if (jVar3 == iVar2) {
        jVar3 = jas_matrix_numcols(c2);
        if (jVar3 == iVar2) {
          for (r._4_4_ = 0; r._4_4_ < iVar1; r._4_4_ = r._4_4_ + 1) {
            c1p = jas_matrix_getref(c0,(long)r._4_4_,0);
            c2p = jas_matrix_getref(c1,(long)r._4_4_,0);
            local_78 = jas_matrix_getref(c2,(long)r._4_4_,0);
            for (r._0_4_ = iVar2; 0 < (int)r; r._0_4_ = (int)r + -1) {
              jVar7 = *c1p;
              y_00 = *c2p;
              y_01 = *local_78;
              jVar4 = jpc_fix_mul(0x2cdd,y_01);
              jVar4 = jpc_fix_add(jVar7,jVar4);
              jVar5 = jpc_fix_mul(-0xb03,y_00);
              jVar5 = jpc_fix_add(jVar7,jVar5);
              jVar6 = jpc_fix_mul(-0x16da,y_01);
              jVar5 = jpc_fix_add(jVar5,jVar6);
              jVar6 = jpc_fix_mul(0x38b4,y_00);
              jVar7 = jpc_fix_add(jVar7,jVar6);
              *c1p = jVar4;
              *c2p = jVar5;
              *local_78 = jVar7;
              local_78 = local_78 + 1;
              c2p = c2p + 1;
              c1p = c1p + 1;
            }
          }
          return;
        }
      }
      __assert_fail("jas_matrix_numcols(c1) == numcols && jas_matrix_numcols(c2) == numcols",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                    ,0xea,"void jpc_iict(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
    }
  }
  __assert_fail("jas_matrix_numrows(c1) == numrows && jas_matrix_numrows(c2) == numrows",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                ,0xe8,"void jpc_iict(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
}

Assistant:

void jpc_iict(jas_matrix_t *c0, jas_matrix_t *c1, jas_matrix_t *c2)
{
	int numrows;
	int numcols;
	int i;
	int j;
	jpc_fix_t r;
	jpc_fix_t g;
	jpc_fix_t b;
	jpc_fix_t y;
	jpc_fix_t u;
	jpc_fix_t v;
	jpc_fix_t *c0p;
	jpc_fix_t *c1p;
	jpc_fix_t *c2p;

	numrows = jas_matrix_numrows(c0);
	assert(jas_matrix_numrows(c1) == numrows && jas_matrix_numrows(c2) == numrows);
	numcols = jas_matrix_numcols(c0);
	assert(jas_matrix_numcols(c1) == numcols && jas_matrix_numcols(c2) == numcols);
	for (i = 0; i < numrows; ++i) {
		c0p = jas_matrix_getref(c0, i, 0);
		c1p = jas_matrix_getref(c1, i, 0);
		c2p = jas_matrix_getref(c2, i, 0);
		for (j = numcols; j > 0; --j) {
			y = *c0p;
			u = *c1p;
			v = *c2p;
			r = jpc_fix_add(y, jpc_fix_mul(jpc_dbltofix(1.402), v));
			g = jpc_fix_add3(y, jpc_fix_mul(jpc_dbltofix(-0.34413), u),
			  jpc_fix_mul(jpc_dbltofix(-0.71414), v));
			b = jpc_fix_add(y, jpc_fix_mul(jpc_dbltofix(1.772), u));
			*c0p++ = r;
			*c1p++ = g;
			*c2p++ = b;
		}
	}
}